

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::recursivelyWrapLine(ostream *os,string *paragraph,size_t columns,size_t indent)

{
  ulong uVar1;
  string *psVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_68 [32];
  ulong local_48;
  size_t pos;
  size_t wrapPoint;
  size_t tab;
  size_t width;
  size_t indent_local;
  size_t columns_local;
  string *paragraph_local;
  ostream *os_local;
  
  pos = columns - indent;
  wrapPoint = 0;
  local_48 = 0;
  tab = pos;
  width = indent;
  indent_local = columns;
  columns_local = (size_t)paragraph;
  paragraph_local = (string *)os;
  while( true ) {
    uVar1 = local_48;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar1) {
      addIndent((ostream *)paragraph_local,width);
      poVar4 = std::operator<<((ostream *)paragraph_local,(string *)paragraph);
      std::operator<<(poVar4,"\n");
      return;
    }
    if (local_48 == tab) break;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)paragraph);
    if (*pcVar5 == '\t') {
      wrapPoint = local_48;
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)paragraph);
      std::__cxx11::string::substr((ulong)&local_f8,(ulong)paragraph);
      std::operator+(&local_b8,&local_d8,&local_f8);
      std::__cxx11::string::operator=((string *)paragraph,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d8);
      local_48 = local_48 - 1;
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)paragraph);
      if (*pcVar5 == ' ') {
        pos = local_48;
      }
    }
    local_48 = local_48 + 1;
  }
  addIndent((ostream *)paragraph_local,width);
  psVar2 = paragraph_local;
  std::__cxx11::string::substr((ulong)local_68,(ulong)paragraph);
  poVar4 = std::operator<<((ostream *)psVar2,local_68);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string(local_68);
  psVar2 = paragraph_local;
  std::__cxx11::string::substr((ulong)&local_98,(ulong)paragraph);
  recursivelyWrapLine((ostream *)psVar2,&local_98,indent_local,width + wrapPoint);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

inline void recursivelyWrapLine( std::ostream& os, std::string paragraph, std::size_t columns, std::size_t indent ) {
        std::size_t width = columns-indent;
        std::size_t tab = 0;
        std::size_t wrapPoint = width;
        for( std::size_t pos = 0; pos < paragraph.size(); ++pos ) {
            if( pos == width ) {
                addIndent( os, indent );
                os << paragraph.substr( 0, wrapPoint ) << "\n";
                return recursivelyWrapLine( os, paragraph.substr( wrapPoint+1 ), columns, indent+tab );
            }
            if( paragraph[pos] == '\t' ) {
                    tab = pos;
                    paragraph = paragraph.substr( 0, tab ) + paragraph.substr( tab+1 );
                    pos--;
            }
            else if( paragraph[pos] == ' ' ) {
                wrapPoint = pos;
            }
        }
        addIndent( os, indent );
        os << paragraph << "\n";
    }